

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  ReflectionSchema *this_00;
  OneofDescriptor *oneof_descriptor;
  long *plVar1;
  Type TVar2;
  uint32 uVar3;
  int iVar4;
  MessageLite *pMVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  long lVar8;
  long *plVar9;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  TVar2 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar3 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar5 = ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),field
                        ,factory);
    return (Message *)pMVar5;
  }
  this_00 = &this->schema_;
  uVar3 = ReflectionSchema::GetFieldOffset(this_00,field);
  plVar9 = (long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
  oneof_descriptor = *(OneofDescriptor **)(field + 0x60);
  if (oneof_descriptor == (OneofDescriptor *)0x0) {
    SetBit(this,message,field);
  }
  else if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                   (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                              *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x40))
                                      >> 4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
           *(int *)(field + 0x38)) {
    ClearOneof(this,message,oneof_descriptor);
    lVar8 = *(long *)(field + 0x60);
    if (lVar8 == 0) {
      SetBit(this,message,field);
    }
    else {
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)(lVar8 - *(long *)(*(long *)(lVar8 + 0x10) + 0x40)) >> 4) *
                     -0x55555554 + (this->schema_).oneof_case_offset_)) =
           *(undefined4 *)(field + 0x38);
    }
    uVar3 = ReflectionSchema::GetFieldOffset(this_00,field);
    plVar9 = (long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
    puVar6 = (undefined8 *)ReflectionSchema::GetFieldDefault(this_00,field);
    plVar1 = (long *)*puVar6;
    iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
    uVar7 = (**(code **)(*plVar1 + 0x20))(plVar1,iVar4);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3) = uVar7;
  }
  if (*plVar9 == 0) {
    puVar6 = (undefined8 *)ReflectionSchema::GetFieldDefault(this_00,field);
    plVar1 = (long *)*puVar6;
    iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
    lVar8 = (**(code **)(*plVar1 + 0x20))(plVar1,iVar4);
    *plVar9 = lVar8;
  }
  return (Message *)*plVar9;
}

Assistant:

Message* GeneratedMessageReflection::MutableMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (field->containing_oneof()) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = DefaultRaw<const Message*>(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == NULL) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}